

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

pointer __thiscall gmlc::networking::TcpServer::findSocket(TcpServer *this,int connectorID)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int in_EDX;
  long *plVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long *plVar4;
  long lVar5;
  pointer pVar6;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  lVar5 = CONCAT44(in_register_00000034,connectorID);
  local_30._M_device = (mutex_type *)(lVar5 + 0x30);
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  plVar3 = *(long **)(lVar5 + 0xf8);
  plVar1 = *(long **)(lVar5 + 0x100);
  lVar5 = (long)plVar1 - (long)plVar3 >> 6;
  plVar4 = plVar3;
  if (0 < lVar5) {
    plVar4 = (long *)(((long)plVar1 - (long)plVar3 & 0xffffffffffffffc0U) + (long)plVar3);
    lVar5 = lVar5 + 1;
    plVar3 = plVar3 + 4;
    do {
      if (*(int *)(plVar3[-4] + 0x23c) == in_EDX) {
        plVar3 = plVar3 + -4;
        goto LAB_003cc5eb;
      }
      if (*(int *)(plVar3[-2] + 0x23c) == in_EDX) {
        plVar3 = plVar3 + -2;
        goto LAB_003cc5eb;
      }
      if (*(int *)(*plVar3 + 0x23c) == in_EDX) goto LAB_003cc5eb;
      if (*(int *)(plVar3[2] + 0x23c) == in_EDX) {
        plVar3 = plVar3 + 2;
        goto LAB_003cc5eb;
      }
      lVar5 = lVar5 + -1;
      plVar3 = plVar3 + 8;
    } while (1 < lVar5);
  }
  lVar5 = (long)plVar1 - (long)plVar4 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      plVar3 = plVar1;
      if ((lVar5 != 3) || (plVar3 = plVar4, *(int *)(*plVar4 + 0x23c) == in_EDX)) goto LAB_003cc5eb;
      plVar4 = plVar4 + 2;
    }
    plVar3 = plVar4;
    if (*(int *)(*plVar4 + 0x23c) == in_EDX) goto LAB_003cc5eb;
    plVar4 = plVar4 + 2;
  }
  plVar3 = plVar4;
  if (*(int *)(*plVar4 + 0x23c) != in_EDX) {
    plVar3 = plVar1;
  }
LAB_003cc5eb:
  if (plVar3 == plVar1) {
    (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
    super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
    super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
    super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar3;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
    (this->super_enable_shared_from_this<gmlc::networking::TcpServer>)._M_weak_this.
    super___weak_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  pVar6.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar6.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (pointer)pVar6.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer TcpServer::findSocket(int connectorID) const
{
    std::unique_lock<std::mutex> lock(accepting);
    auto ptr = std::find_if(
        connections.begin(),
        connections.end(),
        [connectorID](const auto& conn) {
            return (conn->getIdentifier() == connectorID);
        });
    if (ptr != connections.end()) {
        return *ptr;
    }
    return nullptr;
}